

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O0

exr_result_t internal_exr_apply_dwab(exr_encode_pipeline_t *encode)

{
  DwaCompressor dwab;
  exr_result_t rv;
  DwaCompressor *in_stack_000005c8;
  DwaCompressor *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t *in_stack_ffffffffffffff30;
  void **in_stack_ffffffffffffff38;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff44;
  exr_encode_pipeline_t *in_stack_ffffffffffffff48;
  exr_decode_pipeline_t *in_stack_ffffffffffffff50;
  exr_encode_pipeline_t *in_stack_ffffffffffffff58;
  AcCompression in_stack_ffffffffffffff64;
  DwaCompressor *in_stack_ffffffffffffff68;
  undefined4 local_c;
  
  internal_exr_huf_compress_spare_bytes();
  local_c = internal_encode_alloc_buffer
                      (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff38
                       ,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (local_c == 0) {
    local_c = DwaCompressor_construct
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    if (local_c == 0) {
      local_c = DwaCompressor_compress(in_stack_000005c8);
    }
    DwaCompressor_destroy(in_stack_ffffffffffffff20);
  }
  return local_c;
}

Assistant:

exr_result_t
internal_exr_apply_dwab (exr_encode_pipeline_t* encode)
{
    exr_result_t  rv;
    DwaCompressor dwab;

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(encode->scratch_buffer_1),
        &(encode->scratch_alloc_size_1),
        internal_exr_huf_compress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwab, STATIC_HUFFMAN, encode, NULL);
        if (rv == EXR_ERR_SUCCESS) rv = DwaCompressor_compress (&dwab);

        DwaCompressor_destroy (&dwab);
    }

    return rv;
}